

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulation.c
# Opt level: O0

int simulateFluid(double **U,double **V,double **P,bndCond *bCond,lattice *grid,fluidSim *sim,
                 MPI_Comm Region,double t_end,char *problem,int opt)

{
  undefined8 uVar1;
  double dVar2;
  double **ppdVar3;
  double **ppdVar4;
  double **ppdVar5;
  fluidSim *pfVar6;
  lattice *bCond_00;
  bndCond *P_00;
  double **U_00;
  undefined8 *puVar7;
  ulong uVar8;
  double adStackY_d0 [3];
  undefined8 uStackY_b8;
  long local_b0;
  undefined8 in_stack_ffffffffffffff58;
  double local_a0;
  double time;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  double local_80;
  double delt;
  double dt;
  double del_vec;
  int rank;
  int n;
  double **RHS;
  double **G;
  double **F;
  double t_end_local;
  fluidSim *sim_local;
  lattice *grid_local;
  bndCond *bCond_local;
  double **P_local;
  double **V_local;
  double **U_local;
  
  if (((U == (double **)0x0) || (V == (double **)0x0)) || (P == (double **)0x0)) {
    U_local._4_4_ = 0;
  }
  else if (((bCond == (bndCond *)0x0) || (grid == (lattice *)0x0)) || (sim == (fluidSim *)0x0)) {
    U_local._4_4_ = 0;
  }
  else {
    adStackY_d0[2] = 5.85866007232425e-318;
    F = (double **)t_end;
    t_end_local = (double)sim;
    sim_local = (fluidSim *)grid;
    grid_local = (lattice *)bCond;
    bCond_local = (bndCond *)P;
    P_local = V;
    V_local = U;
    G = create2Dfield((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58
                     );
    adStackY_d0[2] = 5.85880335136155e-318;
    RHS = create2Dfield((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                        (int)in_stack_ffffffffffffff58);
    adStackY_d0[2] = 5.85891698646009e-318;
    _rank = create2Dfield((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                          (int)in_stack_ffffffffffffff58);
    if (((G == (double **)0x0) || (RHS == (double **)0x0)) || (_rank == (double **)0x0)) {
      U_local._4_4_ = 0;
    }
    else {
      adStackY_d0[2] = 5.85916401928301e-318;
      MPI_Comm_rank(Region,&del_vec);
      delt = 0.0;
      local_80 = *(double *)((long)t_end_local + 0x10);
      del_vec._4_4_ = *(int *)&sim_local->GY;
      if (del_vec._4_4_ < *(int *)((long)&sim_local->GY + 4)) {
        del_vec._4_4_ = *(int *)((long)&sim_local->GY + 4);
      }
      __vla_expr0 = (unsigned_long)&uStackY_b8;
      local_b0 = (long)&uStackY_b8 - ((ulong)(del_vec._4_4_ + 3) * 8 + 0xf & 0xfffffffffffffff0);
      __vla_expr1 = (ulong)(del_vec._4_4_ + 3);
      uVar8 = (ulong)(del_vec._4_4_ + 3) * 8 + 0xf & 0xfffffffffffffff0;
      puVar7 = (undefined8 *)(local_b0 - uVar8);
      time = (double)(ulong)(del_vec._4_4_ + 3);
      del_vec._4_4_ = 1;
      if (opt < 0x10) {
        dt = (double)F * 2.0;
      }
      else {
        uVar8 = (long)opt % 0x10 & 0xffffffff;
        dt = (double)F / (double)(opt / 0x10);
      }
      if (del_vec._0_4_ == 0) {
        uVar1 = *(undefined8 *)t_end_local;
        puVar7[-1] = 0x121961;
        printf("Computing %s with Reynolds-number %lg.\n",uVar1,problem,uVar8);
      }
      else {
        opt = opt - (opt & 1U);
      }
      local_a0 = 0.0;
      while( true ) {
        dVar2 = local_a0;
        if ((double)F < local_a0) break;
        if ((opt & 1U) != 0) {
          puVar7[-1] = 0x1219b4;
          printf("Time is at %lg seconds\n",dVar2);
        }
        ppdVar4 = V_local;
        ppdVar3 = P_local;
        bCond_00 = grid_local;
        pfVar6 = sim_local;
        puVar7[-1] = 0x1219c9;
        setBCond(ppdVar4,ppdVar3,(lattice *)pfVar6,(bndCond *)bCond_00);
        puVar7[-1] = 0x1219de;
        setSpecBCond((double **)puVar7[3],(double **)puVar7[2],(lattice *)puVar7[1],(char *)*puVar7)
        ;
        puVar7[-2] = t_end_local;
        puVar7[-3] = 0x121a10;
        compFG((double **)puVar7[0xf],(double **)puVar7[0xe],(double **)puVar7[0xd],
               (double **)puVar7[0xc],(char **)puVar7[0xb],(double)puVar7[10],(lattice *)puVar7[9],
               (fluidSim *)puVar7[0x11]);
        pfVar6 = sim_local;
        ppdVar5 = G;
        ppdVar4 = RHS;
        ppdVar3 = _rank;
        dVar2 = local_80;
        puVar7[-1] = 0x121a2e;
        compRHS(ppdVar5,ppdVar4,ppdVar3,(lattice *)pfVar6,dVar2);
        puVar7[-2] = sim_local;
        puVar7[-1] = Region;
        puVar7[-3] = 0x121a6a;
        solveSORforPoisson((double **)puVar7[0xd],(double **)puVar7[0xc],(char **)puVar7[0xb],
                           (double *)puVar7[10],(double *)puVar7[9],(fluidSim *)puVar7[8],
                           (lattice *)puVar7[0xf],(MPI_Comm)puVar7[0x10]);
        U_00 = V_local;
        ppdVar5 = P_local;
        P_00 = bCond_local;
        pfVar6 = sim_local;
        ppdVar4 = G;
        ppdVar3 = RHS;
        dVar2 = local_80;
        puVar7[-2] = grid_local->dely;
        puVar7[-3] = 0x121aa0;
        adaptUV(U_00,ppdVar5,(double **)P_00,ppdVar4,ppdVar3,dVar2,(lattice *)pfVar6,
                (char **)puVar7[-2]);
        puVar7[-2] = Region;
        puVar7[-3] = 0x121ad5;
        exchangeMat((double **)puVar7[0x13],*(int *)((long)puVar7 + 0x94),*(int *)(puVar7 + 0x12),
                    (double *)puVar7[0x11],(double *)puVar7[0x10],(lattice *)puVar7[0xf],
                    (MPI_Comm)puVar7[0x17]);
        puVar7[-2] = Region;
        puVar7[-3] = 0x121b0a;
        exchangeMat((double **)puVar7[0x13],*(int *)((long)puVar7 + 0x94),*(int *)(puVar7 + 0x12),
                    (double *)puVar7[0x11],(double *)puVar7[0x10],(lattice *)puVar7[0xf],
                    (MPI_Comm)puVar7[0x17]);
        puVar7[-1] = 0x121b23;
        delt = compDelt((lattice *)puVar7[8],(double **)puVar7[7],(double **)puVar7[6],
                        (fluidSim *)puVar7[5]);
        if (dt * (double)del_vec._4_4_ < local_a0) {
          puVar7[-1] = 0x121b65;
          dumpFields((MPI_Comm)puVar7[0x13],(double **)puVar7[0x12],(double **)puVar7[0x11],
                     (double **)puVar7[0x10],(lattice *)puVar7[0xf],*(int *)((long)puVar7 + 0x74));
          del_vec._4_4_ = del_vec._4_4_ + 1;
        }
        puVar7[-1] = 0x121b92;
        MPI_Allreduce(&delt,&local_80,1,&ompi_mpi_double,&ompi_mpi_op_min,Region);
        local_a0 = local_80 + local_a0;
      }
      if (0xf < opt) {
        puVar7[-1] = 0x121bd3;
        dumpFields((MPI_Comm)puVar7[0x13],(double **)puVar7[0x12],(double **)puVar7[0x11],
                   (double **)puVar7[0x10],(lattice *)puVar7[0xf],*(int *)((long)puVar7 + 0x74));
      }
      if (del_vec._0_4_ == 0) {
        puVar7[-1] = 0x121be7;
        printf("[Simulation complete!]\n");
      }
      puVar7[-1] = 0x121bfa;
      destroy2Dfield((void **)puVar7[1],*(int *)((long)puVar7 + 4));
      puVar7[-1] = 0x121c0d;
      destroy2Dfield((void **)puVar7[1],*(int *)((long)puVar7 + 4));
      puVar7[-1] = 0x121c1d;
      destroy2Dfield((void **)puVar7[1],*(int *)((long)puVar7 + 4));
      U_local._4_4_ = del_vec._4_4_;
    }
  }
  return U_local._4_4_;
}

Assistant:

int simulateFluid (REAL **U, REAL **V, REAL **P,
		bndCond* bCond, lattice *grid, fluidSim *sim, MPI_Comm Region,
		REAL t_end, const char *problem, int opt)
{
	/* Simulate the fluid characterized by sim, grid and bCond */
	/* Error checking */
	if (!U || !V|| !P)
		return 0;
	if (!bCond || !grid || !sim)
		return 0;
	/* Auxiliary Grids:
	   RHS is used for the Poisson-Solver so no ghost cells are neccessary */
	REAL **F = create2Dfield(grid->deli+1,grid->delj+1);
	REAL **G = create2Dfield(grid->deli+1,grid->delj+1);
	REAL **RHS = create2Dfield(grid->deli,grid->delj);
	if (!F || !G || !RHS)
		return 0;
	int n, rank;
	MPI_Comm_rank(Region,&rank);
	REAL del_vec, dt = 0, delt = sim->dt;

	n = grid->deli;
	if (grid->delj > n)
		n = grid->delj;
	REAL buf1[n+3], buf2[n+3];
	n = 1;
	if (opt >= OUTPUT)
		del_vec = t_end/(opt/OUTPUT);
	else
		del_vec = t_end*2;
	/* Begin the simulation */
	if (rank == 0)
		printf("Computing %s with Reynolds-number %lg.\n",problem,sim->Re);
	else
		opt -= opt&PRINT;
	for (REAL time = 0; time <= t_end; time += delt)
	{
		if (opt & PRINT)
			printf("Time is at %lg seconds\n",time);
		/* Update all parameters and fields for the iteration */
		setBCond(U,V,grid,bCond);
		setSpecBCond(U,V,grid,problem);
		compFG(U,V,F,G,bCond->FLAG,delt,grid,sim);
		compRHS(F,G,RHS,grid,delt);

		/* Solve the Poisson Equation */
		solveSORforPoisson(P,RHS,bCond->FLAG,buf1,buf2,sim,grid, Region);
		/* Update U and V through F,G and P */
		adaptUV(U,V,P,F,G,delt,grid,bCond->FLAG);
		exchangeMat(U,2,1,buf1,buf2,grid,Region);
		exchangeMat(V,1,2,buf1,buf2,grid,Region);
		dt = compDelt(grid,U,V,sim);

		if (time > del_vec*n)
		{
			dumpFields(Region,U,V,P,grid,n-1);
			n++;
		}
		MPI_Allreduce(&dt,&delt,1,MPI_DOUBLE,MPI_MIN,Region);
	}
	if (opt >= OUTPUT)
		dumpFields(Region,U,V,P,grid,n-1);
	if (rank == 0)
		printf("[Simulation complete!]\n");

	/* Destroy non-simulated grids */
	destroy2Dfield((void**)F,grid->deli+1);
	destroy2Dfield((void**)G,grid->deli+1);
	destroy2Dfield((void**)RHS,grid->deli);
	return n;
}